

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char **ppcVar5;
  char *pcVar6;
  
LAB_0048d611:
  while( true ) {
    uVar4 = (long)end - (long)ptr;
    if ((long)uVar4 < 1) {
      return -1;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    ppcVar5 = (char **)(ulong)bVar1;
    if (ppcVar5 < (char **)0xe) break;
switchD_0048d63a_caseD_2:
    ptr = (char *)((byte *)ptr + 1);
  }
  pcVar6 = (char *)((long)&switchD_0048d63a::switchdataD_00586384 +
                   (long)(int)(&switchD_0048d63a::switchdataD_00586384)[(long)ppcVar5]);
  switch(ppcVar5) {
  case (char **)0x0:
  case (char **)0x1:
  case (char **)0x8:
    break;
  default:
    goto switchD_0048d63a_caseD_2;
  case (char **)0x5:
    if (uVar4 == 1) {
      return -2;
    }
    iVar2 = (*enc[3].literalScanners[1])(enc,ptr,pcVar6,ppcVar5);
    if (iVar2 == 0) {
      ptr = (char *)((byte *)ptr + 2);
      goto LAB_0048d611;
    }
    break;
  case (char **)0x6:
    if (uVar4 < 3) {
      return -2;
    }
    iVar2 = (*enc[3].sameName)(enc,ptr,pcVar6);
    if (iVar2 == 0) {
      ptr = (char *)((byte *)ptr + 3);
      goto LAB_0048d611;
    }
    break;
  case (char **)0x7:
    if (uVar4 < 4) {
      return -2;
    }
    iVar2 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar6,(char *)ppcVar5);
    if (iVar2 == 0) {
      ptr = (char *)((byte *)ptr + 4);
      goto LAB_0048d611;
    }
    break;
  case (char **)0xc:
  case (char **)0xd:
    goto switchD_0048d63a_caseD_c;
  }
  *nextTokPtr = ptr;
  goto LAB_0048d6b1;
switchD_0048d63a_caseD_c:
  ptr = (char *)((byte *)ptr + 1);
  if ((uint)bVar1 == open) {
    if (end == ptr || (long)end - (long)ptr < 0) {
      iVar2 = -0x1b;
    }
    else {
      *nextTokPtr = ptr;
      uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      if ((uVar3 < 0x1f) && ((0x40300e00U >> (uVar3 & 0x1f) & 1) != 0)) {
        iVar2 = 0x1b;
      }
      else {
LAB_0048d6b1:
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  goto LAB_0048d611;
}

Assistant:

static int PTRCALL
PREFIX(scanLit)(int open, const ENCODING *enc,
                const char *ptr, const char *end,
                const char **nextTokPtr)
{
  while (HAS_CHAR(enc, ptr, end)) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (! HAS_CHAR(enc, ptr, end))
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_CR: case BT_LF:
      case BT_GT: case BT_PERCNT: case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}